

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_annotations.cc
# Opt level: O3

void AnnotateMemoryIsInitialized(char *param_1,int param_2,void *mem,size_t size)

{
  return;
}

Assistant:

void AnnotateMemoryIsInitialized(const char *, int,
                                 const volatile void *mem, size_t size) {
#if __has_feature(memory_sanitizer)
  __msan_unpoison(mem, size);
#else
  (void)mem;
  (void)size;
#endif
}